

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O2

void __thiscall rpc_tests::rpc_arg_helper::test_method(rpc_arg_helper *this)

{
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  Fallback fallback_02;
  Fallback fallback_03;
  Fallback fallback_04;
  Fallback fallback_05;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  RPCArgOptions opts_02;
  RPCArgOptions opts_03;
  RPCArgOptions opts_04;
  RPCArgOptions opts_05;
  long lVar1;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  string_view json;
  string_view json_00;
  string in_stack_fffffffffffff0a8;
  undefined1 auStack_f38 [8];
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> local_f30;
  allocator_type local_f0f;
  allocator<char> local_f0e;
  allocator<char> local_f0d;
  allocator<char> local_f0c;
  allocator<char> local_f0b;
  allocator<char> local_f0a;
  allocator<char> local_f09;
  allocator<char> local_f08;
  allocator<char> local_f07;
  allocator<char> local_f06;
  allocator<char> local_f05;
  allocator<char> local_f04;
  allocator<char> local_f03;
  allocator<char> local_f02;
  allocator<char> local_f01;
  vector<RPCArg,_std::allocator<RPCArg>_> params;
  uint64_t DEFAULT_UINT64_T;
  char *DEFAULT_STRING;
  undefined7 uStack_ed8;
  bool DEFAULT_BOOL;
  bool local_ed0;
  undefined7 uStack_ecf;
  _Alloc_hider local_ec8;
  size_type local_ec0;
  undefined1 in_stack_fffffffffffff148;
  undefined1 in_stack_fffffffffffff149 [15];
  pointer in_stack_fffffffffffff158;
  undefined2 in_stack_fffffffffffff160;
  undefined6 in_stack_fffffffffffff162;
  undefined2 in_stack_fffffffffffff168;
  undefined8 in_stack_fffffffffffff16a;
  undefined1 in_stack_fffffffffffff172 [30];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_e68;
  undefined1 local_e10;
  string local_e08 [32];
  RPCArgOptions local_de8;
  string local_da0 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_d80;
  undefined1 local_d28;
  string local_d20 [32];
  RPCArgOptions local_d00;
  string local_cb8 [32];
  UniValue local_c98;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_c40;
  string local_be0 [32];
  RPCArgOptions local_bc0;
  string local_b78 [32];
  UniValue local_b58;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_b00;
  string local_aa0 [32];
  RPCArgOptions local_a80;
  string local_a38 [32];
  RPCMethodImpl check_positional;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_9b8;
  string local_958 [32];
  RPCArgOptions local_938;
  string local_8f0 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_8d0;
  undefined1 local_878;
  string local_870 [32];
  RPCArgOptions local_850;
  string local_808 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_7e8;
  undefined1 local_790;
  string local_788 [32];
  RPCArg local_768 [4];
  RPCArg local_348;
  RPCArg local_240;
  RPCArg local_138;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  DEFAULT_BOOL = true;
  DEFAULT_STRING = "default";
  DEFAULT_UINT64_T = 3;
  std::__cxx11::string::string<std::allocator<char>>
            (local_788,"req_int",(allocator<char> *)(auStack_f38 + 0x37));
  local_7e8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_790 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_808,"",(allocator<char> *)(auStack_f38 + 0x36));
  local_850.oneline_description._M_dataplus._M_p = (pointer)&local_850.oneline_description.field_2;
  local_850.skip_type_check = false;
  local_850.oneline_description._M_string_length = 0;
  local_850.oneline_description.field_2._M_local_buf[0] = '\0';
  local_850.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_850.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_850.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_850.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_850._58_8_ = 0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = DEFAULT_UINT64_T;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_80_ = _auStack_f38;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = DEFAULT_STRING;
  description._M_dataplus._M_p._7_1_ = DEFAULT_BOOL;
  description._M_dataplus._M_p._0_7_ = uStack_ed8;
  description._M_string_length._0_1_ = local_ed0;
  description._M_string_length._1_7_ = uStack_ecf;
  description.field_2._M_allocated_capacity = (size_type)local_ec8._M_p;
  description.field_2._8_8_ = local_ec0;
  opts._1_15_ = in_stack_fffffffffffff149;
  opts.skip_type_check = (bool)in_stack_fffffffffffff148;
  opts.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff158;
  opts.oneline_description.field_2._M_allocated_capacity._0_2_ = in_stack_fffffffffffff160;
  opts.oneline_description.field_2._M_allocated_capacity._2_6_ = in_stack_fffffffffffff162;
  opts.oneline_description.field_2._8_2_ = in_stack_fffffffffffff168;
  opts._34_8_ = in_stack_fffffffffffff16a;
  opts._42_30_ = in_stack_fffffffffffff172;
  RPCArg::RPCArg(local_768,in_stack_fffffffffffff0a8,(Type)local_788,fallback,description,opts);
  std::__cxx11::string::string<std::allocator<char>>
            (local_870,"req_str",(allocator<char> *)(auStack_f38 + 0x35));
  local_8d0._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_878 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_8f0,"",(allocator<char> *)(auStack_f38 + 0x34));
  local_938.oneline_description._M_dataplus._M_p = (pointer)&local_938.oneline_description.field_2;
  local_938.skip_type_check = false;
  local_938.oneline_description._M_string_length = 0;
  local_938.oneline_description.field_2._M_local_buf[0] = '\0';
  local_938.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_938.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_938.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_938.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_938._58_8_ = 0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = DEFAULT_UINT64_T;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_80_ = _auStack_f38;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = DEFAULT_STRING;
  description_00._M_dataplus._M_p._7_1_ = DEFAULT_BOOL;
  description_00._M_dataplus._M_p._0_7_ = uStack_ed8;
  description_00._M_string_length._0_1_ = local_ed0;
  description_00._M_string_length._1_7_ = uStack_ecf;
  description_00.field_2._M_allocated_capacity = (size_type)local_ec8._M_p;
  description_00.field_2._8_8_ = local_ec0;
  opts_00._1_15_ = in_stack_fffffffffffff149;
  opts_00.skip_type_check = (bool)in_stack_fffffffffffff148;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff158;
  opts_00.oneline_description.field_2._M_allocated_capacity._0_2_ = in_stack_fffffffffffff160;
  opts_00.oneline_description.field_2._M_allocated_capacity._2_6_ = in_stack_fffffffffffff162;
  opts_00.oneline_description.field_2._8_2_ = in_stack_fffffffffffff168;
  opts_00._34_8_ = in_stack_fffffffffffff16a;
  opts_00._42_30_ = in_stack_fffffffffffff172;
  RPCArg::RPCArg(local_768 + 1,in_stack_fffffffffffff0a8,(Type)local_870,fallback_00,description_00,
                 opts_00);
  std::__cxx11::string::string<std::allocator<char>>
            (local_958,"def_uint64_t",(allocator<char> *)(auStack_f38 + 0x33));
  UniValue::UniValue<const_unsigned_long_&,_unsigned_long,_true>
            ((UniValue *)&check_positional,&DEFAULT_UINT64_T);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_9b8,
             (UniValue *)&check_positional);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a38,"",(allocator<char> *)(auStack_f38 + 0x32));
  local_a80.oneline_description._M_dataplus._M_p = (pointer)&local_a80.oneline_description.field_2;
  local_a80.skip_type_check = false;
  local_a80.oneline_description._M_string_length = 0;
  local_a80.oneline_description.field_2._M_local_buf[0] = '\0';
  local_a80.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a80.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_a80.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_a80.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_a80._58_8_ = 0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = DEFAULT_UINT64_T;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_80_ = _auStack_f38;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = DEFAULT_STRING;
  description_01._M_dataplus._M_p._7_1_ = DEFAULT_BOOL;
  description_01._M_dataplus._M_p._0_7_ = uStack_ed8;
  description_01._M_string_length._0_1_ = local_ed0;
  description_01._M_string_length._1_7_ = uStack_ecf;
  description_01.field_2._M_allocated_capacity = (size_type)local_ec8._M_p;
  description_01.field_2._8_8_ = local_ec0;
  opts_01._1_15_ = in_stack_fffffffffffff149;
  opts_01.skip_type_check = (bool)in_stack_fffffffffffff148;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff158;
  opts_01.oneline_description.field_2._M_allocated_capacity._0_2_ = in_stack_fffffffffffff160;
  opts_01.oneline_description.field_2._M_allocated_capacity._2_6_ = in_stack_fffffffffffff162;
  opts_01.oneline_description.field_2._8_2_ = in_stack_fffffffffffff168;
  opts_01._34_8_ = in_stack_fffffffffffff16a;
  opts_01._42_30_ = in_stack_fffffffffffff172;
  RPCArg::RPCArg(local_768 + 2,in_stack_fffffffffffff0a8,(Type)local_958,fallback_01,description_01,
                 opts_01);
  std::__cxx11::string::string<std::allocator<char>>
            (local_aa0,"def_string",(allocator<char> *)(auStack_f38 + 0x31));
  UniValue::UniValue<const_char_*const_&,_const_char_*,_true>(&local_b58,&DEFAULT_STRING);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_b00,&local_b58);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b78,"",(allocator<char> *)(auStack_f38 + 0x30));
  local_bc0.oneline_description._M_dataplus._M_p = (pointer)&local_bc0.oneline_description.field_2;
  local_bc0.skip_type_check = false;
  local_bc0.oneline_description._M_string_length = 0;
  local_bc0.oneline_description.field_2._M_local_buf[0] = '\0';
  local_bc0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_bc0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_bc0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_bc0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_bc0._58_8_ = 0;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = DEFAULT_UINT64_T;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_80_ = _auStack_f38;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = DEFAULT_STRING;
  description_02._M_dataplus._M_p._7_1_ = DEFAULT_BOOL;
  description_02._M_dataplus._M_p._0_7_ = uStack_ed8;
  description_02._M_string_length._0_1_ = local_ed0;
  description_02._M_string_length._1_7_ = uStack_ecf;
  description_02.field_2._M_allocated_capacity = (size_type)local_ec8._M_p;
  description_02.field_2._8_8_ = local_ec0;
  opts_02._1_15_ = in_stack_fffffffffffff149;
  opts_02.skip_type_check = (bool)in_stack_fffffffffffff148;
  opts_02.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff158;
  opts_02.oneline_description.field_2._M_allocated_capacity._0_2_ = in_stack_fffffffffffff160;
  opts_02.oneline_description.field_2._M_allocated_capacity._2_6_ = in_stack_fffffffffffff162;
  opts_02.oneline_description.field_2._8_2_ = in_stack_fffffffffffff168;
  opts_02._34_8_ = in_stack_fffffffffffff16a;
  opts_02._42_30_ = in_stack_fffffffffffff172;
  RPCArg::RPCArg(local_768 + 3,in_stack_fffffffffffff0a8,(Type)local_aa0,fallback_02,description_02,
                 opts_02);
  std::__cxx11::string::string<std::allocator<char>>
            (local_be0,"def_bool",(allocator<char> *)(auStack_f38 + 0x2f));
  UniValue::UniValue<const_bool_&,_bool,_true>(&local_c98,&DEFAULT_BOOL);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_c40,&local_c98);
  std::__cxx11::string::string<std::allocator<char>>
            (local_cb8,"",(allocator<char> *)(auStack_f38 + 0x2e));
  local_d00.oneline_description._M_dataplus._M_p = (pointer)&local_d00.oneline_description.field_2;
  local_d00.skip_type_check = false;
  local_d00.oneline_description._M_string_length = 0;
  local_d00.oneline_description.field_2._M_local_buf[0] = '\0';
  local_d00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_d00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_d00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_d00._58_8_ = 0;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = DEFAULT_UINT64_T;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_80_ = _auStack_f38;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = DEFAULT_STRING;
  description_03._M_dataplus._M_p._7_1_ = DEFAULT_BOOL;
  description_03._M_dataplus._M_p._0_7_ = uStack_ed8;
  description_03._M_string_length._0_1_ = local_ed0;
  description_03._M_string_length._1_7_ = uStack_ecf;
  description_03.field_2._M_allocated_capacity = (size_type)local_ec8._M_p;
  description_03.field_2._8_8_ = local_ec0;
  opts_03._1_15_ = in_stack_fffffffffffff149;
  opts_03.skip_type_check = (bool)in_stack_fffffffffffff148;
  opts_03.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff158;
  opts_03.oneline_description.field_2._M_allocated_capacity._0_2_ = in_stack_fffffffffffff160;
  opts_03.oneline_description.field_2._M_allocated_capacity._2_6_ = in_stack_fffffffffffff162;
  opts_03.oneline_description.field_2._8_2_ = in_stack_fffffffffffff168;
  opts_03._34_8_ = in_stack_fffffffffffff16a;
  opts_03._42_30_ = in_stack_fffffffffffff172;
  RPCArg::RPCArg(&local_348,in_stack_fffffffffffff0a8,(Type)local_be0,fallback_03,description_03,
                 opts_03);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d20,"opt_double",(allocator<char> *)(auStack_f38 + 0x2d));
  local_d80._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_d28 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_da0,"",(allocator<char> *)(auStack_f38 + 0x2c));
  local_de8.oneline_description._M_dataplus._M_p = (pointer)&local_de8.oneline_description.field_2;
  local_de8.skip_type_check = false;
  local_de8.oneline_description._M_string_length = 0;
  local_de8.oneline_description.field_2._M_local_buf[0] = '\0';
  local_de8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_de8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_de8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_de8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_de8._58_8_ = 0;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = DEFAULT_UINT64_T;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_80_ = _auStack_f38;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = DEFAULT_STRING;
  description_04._M_dataplus._M_p._7_1_ = DEFAULT_BOOL;
  description_04._M_dataplus._M_p._0_7_ = uStack_ed8;
  description_04._M_string_length._0_1_ = local_ed0;
  description_04._M_string_length._1_7_ = uStack_ecf;
  description_04.field_2._M_allocated_capacity = (size_type)local_ec8._M_p;
  description_04.field_2._8_8_ = local_ec0;
  opts_04._1_15_ = in_stack_fffffffffffff149;
  opts_04.skip_type_check = (bool)in_stack_fffffffffffff148;
  opts_04.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff158;
  opts_04.oneline_description.field_2._M_allocated_capacity._0_2_ = in_stack_fffffffffffff160;
  opts_04.oneline_description.field_2._M_allocated_capacity._2_6_ = in_stack_fffffffffffff162;
  opts_04.oneline_description.field_2._8_2_ = in_stack_fffffffffffff168;
  opts_04._34_8_ = in_stack_fffffffffffff16a;
  opts_04._42_30_ = in_stack_fffffffffffff172;
  RPCArg::RPCArg(&local_240,in_stack_fffffffffffff0a8,(Type)local_d20,fallback_04,description_04,
                 opts_04);
  std::__cxx11::string::string<std::allocator<char>>
            (local_e08,"opt_string",(allocator<char> *)(auStack_f38 + 0x2b));
  local_e68._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_e10 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffff178,"",(allocator<char> *)(auStack_f38 + 0x2a));
  local_ec8._M_p = &stack0xfffffffffffff148;
  local_ed0 = false;
  local_ec0 = 0;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = DEFAULT_UINT64_T;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_80_ = _auStack_f38;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = DEFAULT_STRING;
  description_05._M_dataplus._M_p._7_1_ = DEFAULT_BOOL;
  description_05._M_dataplus._M_p._0_7_ = uStack_ed8;
  description_05._M_string_length._0_1_ = 0;
  description_05._M_string_length._1_7_ = uStack_ecf;
  description_05.field_2._M_allocated_capacity = (size_type)local_ec8._M_p;
  description_05.field_2._8_8_ = 0;
  opts_05._42_30_ = in_stack_fffffffffffff172;
  opts_05._0_42_ = ZEXT1542(in_stack_fffffffffffff149) << 8;
  RPCArg::RPCArg(&local_138,in_stack_fffffffffffff0a8,(Type)local_e08,fallback_05,description_05,
                 opts_05);
  __l._M_len = 7;
  __l._M_array = local_768;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            (&params,__l,(allocator_type *)(auStack_f38 + 0x29));
  lVar1 = 0x630;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_768[0].m_names._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x108;
  } while (lVar1 != -0x108);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)&local_ed0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff178);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_e68._M_first);
  std::__cxx11::string::~string(local_e08);
  RPCArgOptions::~RPCArgOptions(&local_de8);
  std::__cxx11::string::~string(local_da0);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_d80._M_first);
  std::__cxx11::string::~string(local_d20);
  RPCArgOptions::~RPCArgOptions(&local_d00);
  std::__cxx11::string::~string(local_cb8);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_c40);
  UniValue::~UniValue(&local_c98);
  std::__cxx11::string::~string(local_be0);
  RPCArgOptions::~RPCArgOptions(&local_bc0);
  std::__cxx11::string::~string(local_b78);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_b00);
  UniValue::~UniValue(&local_b58);
  std::__cxx11::string::~string(local_aa0);
  RPCArgOptions::~RPCArgOptions(&local_a80);
  std::__cxx11::string::~string(local_a38);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_9b8);
  UniValue::~UniValue((UniValue *)&check_positional);
  std::__cxx11::string::~string(local_958);
  RPCArgOptions::~RPCArgOptions(&local_938);
  std::__cxx11::string::~string(local_8f0);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_8d0._M_first);
  std::__cxx11::string::~string(local_870);
  RPCArgOptions::~RPCArgOptions(&local_850);
  std::__cxx11::string::~string(local_808);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_7e8._M_first);
  std::__cxx11::string::~string(local_788);
  check_positional.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  check_positional.super__Function_base._M_functor._8_8_ = 0;
  check_positional._M_invoker =
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp:618:50)>
       ::_M_invoke;
  check_positional.super__Function_base._M_manager =
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp:618:50)>
       ::_M_manager;
  json._M_str = "[5, \"hello\", null, null, null, null, null]";
  json._M_len = 0x2a;
  JSON((UniValue *)local_768,json);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)(auStack_f38 + 8),
             &check_positional);
  CheckRpc(&params,(UniValue *)local_768,(RPCMethodImpl *)(auStack_f38 + 8));
  std::_Function_base::~_Function_base((_Function_base *)(auStack_f38 + 8));
  UniValue::~UniValue((UniValue *)local_768);
  json_00._M_str = "[5, \"hello\", 4, \"test\", true, 1.23, \"world\"]";
  json_00._M_len = 0x2c;
  JSON((UniValue *)local_768,json_00);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             &stack0xfffffffffffff0b0,&check_positional);
  CheckRpc(&params,(UniValue *)local_768,(RPCMethodImpl *)&stack0xfffffffffffff0b0);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff0b0);
  UniValue::~UniValue((UniValue *)local_768);
  std::_Function_base::~_Function_base(&check_positional.super__Function_base);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&params);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_arg_helper)
{
    constexpr bool DEFAULT_BOOL = true;
    constexpr auto DEFAULT_STRING = "default";
    constexpr uint64_t DEFAULT_UINT64_T = 3;

    //! Parameters with which the RPCHelpMan is instantiated
    const std::vector<RPCArg> params{
        // Required arg
        {"req_int", RPCArg::Type::NUM, RPCArg::Optional::NO, ""},
        {"req_str", RPCArg::Type::STR, RPCArg::Optional::NO, ""},
        // Default arg
        {"def_uint64_t", RPCArg::Type::NUM, RPCArg::Default{DEFAULT_UINT64_T}, ""},
        {"def_string", RPCArg::Type::STR, RPCArg::Default{DEFAULT_STRING}, ""},
        {"def_bool", RPCArg::Type::BOOL, RPCArg::Default{DEFAULT_BOOL}, ""},
        // Optional arg without default
        {"opt_double", RPCArg::Type::NUM, RPCArg::Optional::OMITTED, ""},
        {"opt_string", RPCArg::Type::STR, RPCArg::Optional::OMITTED, ""}
    };

    //! Check that `self.Arg` returns the same value as the `request.params` accessors
    RPCHelpMan::RPCMethodImpl check_positional = [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue {
            BOOST_CHECK_EQUAL(self.Arg<int>("req_int"), request.params[0].getInt<int>());
            BOOST_CHECK_EQUAL(self.Arg<std::string>("req_str"), request.params[1].get_str());
            BOOST_CHECK_EQUAL(self.Arg<uint64_t>("def_uint64_t"), request.params[2].isNull() ? DEFAULT_UINT64_T : request.params[2].getInt<uint64_t>());
            BOOST_CHECK_EQUAL(self.Arg<std::string>("def_string"), request.params[3].isNull() ? DEFAULT_STRING : request.params[3].get_str());
            BOOST_CHECK_EQUAL(self.Arg<bool>("def_bool"), request.params[4].isNull() ? DEFAULT_BOOL : request.params[4].get_bool());
            if (!request.params[5].isNull()) {
                BOOST_CHECK_EQUAL(self.MaybeArg<double>("opt_double").value(), request.params[5].get_real());
            } else {
                BOOST_CHECK(!self.MaybeArg<double>("opt_double"));
            }
            if (!request.params[6].isNull()) {
                BOOST_CHECK(self.MaybeArg<std::string>("opt_string"));
                BOOST_CHECK_EQUAL(*self.MaybeArg<std::string>("opt_string"), request.params[6].get_str());
            } else {
                BOOST_CHECK(!self.MaybeArg<std::string>("opt_string"));
            }
            return UniValue{};
        };
    CheckRpc(params, UniValue{JSON(R"([5, "hello", null, null, null, null, null])")}, check_positional);
    CheckRpc(params, UniValue{JSON(R"([5, "hello", 4, "test", true, 1.23, "world"])")}, check_positional);
}